

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec_helper.c
# Opt level: O2

void helper_gvec_fcaddh_aarch64(void *vd,void *vn,void *vm,void *vfpst,uint32_t desc)

{
  uint uVar1;
  ushort uVar2;
  float16 fVar3;
  float16 fVar4;
  uintptr_t i;
  ulong uVar5;
  ushort uVar6;
  ulong uVar7;
  
  uVar1 = (desc & 0x1f) * 8 + 8;
  uVar5 = (ulong)uVar1;
  for (uVar7 = 0; uVar7 < uVar1 >> 1; uVar7 = uVar7 + 2) {
    uVar6 = (ushort)((desc & 0x400) << 5);
    fVar4 = *(float16 *)((long)vn + uVar7 * 2 + 2);
    uVar2 = *(ushort *)((long)vm + uVar7 * 2);
    fVar3 = float16_add_aarch64(*(float16 *)((long)vn + uVar7 * 2),
                                *(ushort *)((long)vm + uVar7 * 2 + 2) ^ uVar6 ^ 0x8000,
                                (float_status *)vfpst);
    *(float16 *)((long)vd + uVar7 * 2) = fVar3;
    fVar4 = float16_add_aarch64(fVar4,uVar2 ^ uVar6,(float_status *)vfpst);
    *(float16 *)((long)vd + uVar7 * 2 + 2) = fVar4;
  }
  for (; uVar5 < (desc >> 2 & 0xf8) + 8; uVar5 = uVar5 + 8) {
    *(undefined8 *)((long)vd + uVar5) = 0;
  }
  return;
}

Assistant:

void HELPER(gvec_fcaddh)(void *vd, void *vn, void *vm,
                         void *vfpst, uint32_t desc)
{
    uintptr_t opr_sz = simd_oprsz(desc);
    float16 *d = vd;
    float16 *n = vn;
    float16 *m = vm;
    float_status *fpst = vfpst;
    uint32_t neg_real = extract32(desc, SIMD_DATA_SHIFT, 1);
    uint32_t neg_imag = neg_real ^ 1;
    uintptr_t i;

    /* Shift boolean to the sign bit so we can xor to negate.  */
    neg_real <<= 15;
    neg_imag <<= 15;

    for (i = 0; i < opr_sz / 2; i += 2) {
        float16 e0 = n[H2(i)];
        float16 e1 = m[H2(i + 1)] ^ neg_imag;
        float16 e2 = n[H2(i + 1)];
        float16 e3 = m[H2(i)] ^ neg_real;

        d[H2(i)] = float16_add(e0, e1, fpst);
        d[H2(i + 1)] = float16_add(e2, e3, fpst);
    }
    clear_tail(d, opr_sz, simd_maxsz(desc));
}